

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,Function *F,PSNode *arg,uint idx)

{
  CallBase *this_00;
  Function *pFVar1;
  Function *pFVar2;
  
  pFVar2 = F;
  while (pFVar2 = *(Function **)(pFVar2 + 8), pFVar2 != (Function *)0x0) {
    this_00 = *(CallBase **)(pFVar2 + 0x18);
    if ((this_00 != (CallBase *)0x0) && (this_00[0x10] == (CallBase)0x53)) {
      pFVar1 = llvm::CallBase::getCalledFunction(this_00);
      if (pFVar1 == F) {
        addArgumentOperands(this,(CallInst *)this_00,arg,idx);
      }
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::Function *F,
                                                  PSNode *arg, unsigned idx) {
    using namespace llvm;

    for (auto I = F->use_begin(), E = F->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        const Value *use = *I;
#else
        const Value *use = I->getUser();
#endif
        const CallInst *CI = dyn_cast<CallInst>(use);
        if (CI && CI->getCalledFunction() == F)
            addArgumentOperands(CI, arg, idx);
    }
}